

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_leaf_node.h
# Opt level: O1

void __thiscall compose::BlackLeafNode::PrintName(BlackLeafNode *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"black leaf node :",0x11)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (this->super_LeafNode).super_INode.name_._M_dataplus._M_p,
                      (this->super_LeafNode).super_INode.name_._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void BlackLeafNode::PrintName() {
    std::cout << "black leaf node :" << name_ << std::endl;
}